

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

int Res_WinMarkPaths_rec(Abc_Obj_t *pNode,Abc_Obj_t *pPivot,int nLevelMin)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pNode_00;
  uint local_38;
  int local_34;
  int RetValue;
  int i;
  Abc_Obj_t *pFanin;
  int nLevelMin_local;
  Abc_Obj_t *pPivot_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_NodeIsTravIdPrevious(pNode);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdPrevious(pNode);
      if ((pNode == pPivot) || ((int)(*(uint *)&pNode->field_0x14 >> 0xc) <= nLevelMin)) {
        pNode_local._4_4_ = 0;
      }
      else {
        iVar1 = Abc_ObjIsNode(pNode);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                        ,0x105,"int Res_WinMarkPaths_rec(Abc_Obj_t *, Abc_Obj_t *, int)");
        }
        local_38 = 0;
        for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_34 < iVar1; local_34 = local_34 + 1
            ) {
          pNode_00 = Abc_ObjFanin(pNode,local_34);
          uVar2 = Res_WinMarkPaths_rec(pNode_00,pPivot,nLevelMin);
          local_38 = uVar2 | local_38;
        }
        if (local_38 != 0) {
          Abc_NodeSetTravIdCurrent(pNode);
        }
        pNode_local._4_4_ = local_38;
      }
    }
    else {
      pNode_local._4_4_ = 0;
    }
  }
  else {
    pNode_local._4_4_ = 1;
  }
  return pNode_local._4_4_;
}

Assistant:

int Res_WinMarkPaths_rec( Abc_Obj_t * pNode, Abc_Obj_t * pPivot, int nLevelMin )
{
    Abc_Obj_t * pFanin;
    int i, RetValue;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return 1;
    if ( Abc_NodeIsTravIdPrevious(pNode) )
        return 0;
    // assume that the node does not have access to the leaves
    Abc_NodeSetTravIdPrevious( pNode );
    // skip nodes below the given level
    if ( pNode == pPivot || (int)pNode->Level <= nLevelMin )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    // check if the fanins have access to the leaves
    RetValue = 0;
    Abc_ObjForEachFanin( pNode, pFanin, i )
        RetValue |= Res_WinMarkPaths_rec( pFanin, pPivot, nLevelMin );
    // relabel the node if it has access to the leaves
    if ( RetValue )
        Abc_NodeSetTravIdCurrent( pNode );
    return RetValue;
}